

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

string * miniros::network::determineHost_abi_cxx11_(void)

{
  Level LVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  string *in_RDI;
  bool enabled_8;
  bool enabled_7;
  bool enabled_6;
  socklen_t salen;
  char ip_ [200];
  char preferred_ip [200];
  bool enabled_5;
  int rc;
  ifaddrs *ifp;
  ifaddrs *ifa;
  bool enabled_4;
  char host [1024];
  bool enabled_3;
  bool enabled_2;
  bool enabled_1;
  bool enabled;
  string ip_env;
  undefined8 in_stack_fffffffffffff6b8;
  Level LVar8;
  LogLocation *in_stack_fffffffffffff6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  undefined8 in_stack_fffffffffffff6e0;
  Level LVar9;
  undefined7 in_stack_fffffffffffff6e8;
  undefined1 in_stack_fffffffffffff6ef;
  LogLocation *in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6fc;
  undefined1 in_stack_fffffffffffff6fd;
  undefined1 in_stack_fffffffffffff6fe;
  undefined1 in_stack_fffffffffffff6ff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff700;
  undefined7 in_stack_fffffffffffff730;
  undefined1 in_stack_fffffffffffff737;
  string *in_stack_fffffffffffff738;
  allocator<char> local_853;
  undefined1 local_852;
  allocator<char> local_851;
  string local_850 [32];
  string local_830 [32];
  string local_810 [37];
  allocator<char> local_7eb;
  undefined1 local_7ea;
  LogLocation local_7e9 [2];
  string local_7c8 [32];
  string local_7a8 [16];
  string local_780 [4];
  string local_740 [36];
  socklen_t local_71c;
  char local_718 [208];
  char local_648 [206];
  undefined1 local_57a;
  allocator<char> local_579;
  string local_578 [36];
  int local_554;
  undefined8 *local_550;
  undefined8 *local_548;
  allocator<char> local_53b;
  undefined1 local_53a;
  allocator<char> local_539;
  string local_538 [32];
  char local_518 [1030];
  undefined1 local_112;
  allocator<char> local_111;
  string local_110 [38];
  undefined1 local_ea;
  allocator<char> local_e9;
  string local_e8 [32];
  undefined4 local_c8;
  undefined1 local_c2;
  allocator<char> local_c1;
  string local_c0 [38];
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [32];
  string local_58 [48];
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  bVar3 = get_environment_variable
                    (in_stack_fffffffffffff738,
                     (char *)CONCAT17(in_stack_fffffffffffff737,in_stack_fffffffffffff730));
  LVar8 = (Level)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
  LVar9 = (Level)((ulong)in_stack_fffffffffffff6e0 >> 0x20);
  if (bVar3) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((determineHost::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff700,
                 (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                  CONCAT16(in_stack_fffffffffffff6fe,
                                           CONCAT15(in_stack_fffffffffffff6fd,
                                                    CONCAT14(in_stack_fffffffffffff6fc,
                                                             in_stack_fffffffffffff6f8)))),
                 (allocator<char> *)in_stack_fffffffffffff6f0);
      std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
      std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
      console::initializeLogLocation
                (in_stack_fffffffffffff6f0,
                 (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),LVar9);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    if (determineHost::loc.level_ != Debug) {
      console::setLogLocationLevel(in_stack_fffffffffffff6c0,LVar8);
      console::checkLogLocationEnabled
                ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
    }
    pvVar2 = determineHost::loc.logger_;
    LVar1 = determineHost::loc.level_;
    local_9a = (determineHost::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_9a) {
      in_stack_fffffffffffff6c0 = (LogLocation *)std::__cxx11::string::c_str();
      LVar8 = Debug;
      console::print((FilterBase *)0x0,pvVar2,(Level)(ulong)LVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                     ,0x5b,"std::string miniros::network::determineHost()");
    }
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff700,
                   (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                    CONCAT16(in_stack_fffffffffffff6fe,
                                             CONCAT15(in_stack_fffffffffffff6fd,
                                                      CONCAT14(in_stack_fffffffffffff6fc,
                                                               in_stack_fffffffffffff6f8)))),
                   (allocator<char> *)in_stack_fffffffffffff6f0);
        console::initializeLogLocation
                  (in_stack_fffffffffffff6f0,
                   (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),LVar9);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
      if (determineHost[abi:cxx11]()::loc.level_ != Warn) {
        console::setLogLocationLevel(in_stack_fffffffffffff6c0,LVar8);
        console::checkLogLocationEnabled
                  ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
      }
      local_c2 = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_c2) {
        console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                       (Level)(ulong)determineHost[abi:cxx11]()::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                       ,0x5d,"std::string miniros::network::determineHost()",
                       "invalid ROS_HOSTNAME (an empty string)");
      }
    }
    std::__cxx11::string::string((string *)in_RDI,local_28);
  }
  else {
    bVar3 = get_environment_variable
                      (in_stack_fffffffffffff738,
                       (char *)CONCAT17(in_stack_fffffffffffff737,in_stack_fffffffffffff730));
    LVar8 = (Level)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
    LVar9 = (Level)((ulong)in_stack_fffffffffffff6e0 >> 0x20);
    if (bVar3) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff700,
                   (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                    CONCAT16(in_stack_fffffffffffff6fe,
                                             CONCAT15(in_stack_fffffffffffff6fd,
                                                      CONCAT14(in_stack_fffffffffffff6fc,
                                                               in_stack_fffffffffffff6f8)))),
                   (allocator<char> *)in_stack_fffffffffffff6f0);
        console::initializeLogLocation
                  (in_stack_fffffffffffff6f0,
                   (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),LVar9);
        std::__cxx11::string::~string(local_e8);
        std::allocator<char>::~allocator(&local_e9);
      }
      if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
        console::setLogLocationLevel(in_stack_fffffffffffff6c0,LVar8);
        console::checkLogLocationEnabled
                  ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
      }
      pvVar2 = determineHost[abi:cxx11]()::loc.logger_;
      LVar1 = determineHost[abi:cxx11]()::loc.level_;
      local_ea = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_ea) {
        in_stack_fffffffffffff6c0 = (LogLocation *)std::__cxx11::string::c_str();
        LVar8 = Debug;
        console::print((FilterBase *)0x0,pvVar2,(Level)(ulong)LVar1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                       ,100,"std::string miniros::network::determineHost()");
      }
      lVar5 = std::__cxx11::string::size();
      if (lVar5 == 0) {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff700,
                     (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                      CONCAT16(in_stack_fffffffffffff6fe,
                                               CONCAT15(in_stack_fffffffffffff6fd,
                                                        CONCAT14(in_stack_fffffffffffff6fc,
                                                                 in_stack_fffffffffffff6f8)))),
                     (allocator<char> *)in_stack_fffffffffffff6f0);
          console::initializeLogLocation
                    (in_stack_fffffffffffff6f0,
                     (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),LVar9);
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator(&local_111);
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Warn) {
          console::setLogLocationLevel(in_stack_fffffffffffff6c0,LVar8);
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        }
        local_112 = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_112) {
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         (Level)(ulong)determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x66,"std::string miniros::network::determineHost()",
                         "invalid ROS_IP (an empty string)");
        }
      }
      std::__cxx11::string::string((string *)in_RDI,local_28);
    }
    else {
      memset(local_518,0,0x400);
      iVar4 = gethostname(local_518,0x3ff);
      if (iVar4 == 0) {
        sVar6 = strlen(local_518);
        if ((sVar6 != 0) && (iVar4 = strcmp("localhost",local_518), iVar4 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff700,
                     (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                      CONCAT16(in_stack_fffffffffffff6fe,
                                               CONCAT15(in_stack_fffffffffffff6fd,
                                                        CONCAT14(in_stack_fffffffffffff6fc,
                                                                 in_stack_fffffffffffff6f8)))),
                     (allocator<char> *)in_stack_fffffffffffff6f0);
          std::allocator<char>::~allocator(&local_53b);
          goto LAB_004763f5;
        }
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff700,
                     (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                      CONCAT16(in_stack_fffffffffffff6fe,
                                               CONCAT15(in_stack_fffffffffffff6fd,
                                                        CONCAT14(in_stack_fffffffffffff6fc,
                                                                 in_stack_fffffffffffff6f8)))),
                     (allocator<char> *)in_stack_fffffffffffff6f0);
          console::initializeLogLocation
                    (in_stack_fffffffffffff6f0,
                     (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                     (Level)((ulong)in_stack_fffffffffffff6e0 >> 0x20));
          std::__cxx11::string::~string(local_538);
          std::allocator<char>::~allocator(&local_539);
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Error) {
          console::setLogLocationLevel
                    (in_stack_fffffffffffff6c0,(Level)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        }
        local_53a = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_53a) {
          in_stack_fffffffffffff6b8 = 0;
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         (Level)(ulong)determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x6f);
        }
      }
      local_548 = (undefined8 *)0x0;
      local_550 = (undefined8 *)0x0;
      local_554 = getifaddrs(&local_550);
      if (local_554 < 0) {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff700,
                     (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                      CONCAT16(in_stack_fffffffffffff6fe,
                                               CONCAT15(in_stack_fffffffffffff6fd,
                                                        CONCAT14(in_stack_fffffffffffff6fc,
                                                                 in_stack_fffffffffffff6f8)))),
                     (allocator<char> *)in_stack_fffffffffffff6f0);
          console::initializeLogLocation
                    (in_stack_fffffffffffff6f0,
                     (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                     (Level)((ulong)in_stack_fffffffffffff6e0 >> 0x20));
          std::__cxx11::string::~string(local_578);
          std::allocator<char>::~allocator(&local_579);
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Fatal) {
          console::setLogLocationLevel
                    (in_stack_fffffffffffff6c0,(Level)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        }
        pvVar2 = determineHost[abi:cxx11]()::loc.logger_;
        LVar8 = determineHost[abi:cxx11]()::loc.level_;
        local_57a = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_57a) {
          in_stack_fffffffffffff6c0 = (LogLocation *)strerror(local_554);
          in_stack_fffffffffffff6b8 = 0;
          console::print((FilterBase *)0x0,pvVar2,(Level)(ulong)LVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x7c);
        }
      }
      memset(local_648,0,200);
      local_548 = local_550;
      while( true ) {
        LVar8 = (Level)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
        LVar9 = (Level)((ulong)in_stack_fffffffffffff6e0 >> 0x20);
        if (local_548 == (undefined8 *)0x0) break;
        if (local_548[3] != 0) {
          if (*(short *)local_548[3] == 2) {
            local_71c = 0x10;
          }
          else {
            if (*(short *)local_548[3] != 10) goto LAB_00475eb1;
            local_71c = 0x1c;
          }
          in_stack_fffffffffffff6b8 = CONCAT44(LVar8,1);
          iVar4 = getnameinfo((sockaddr *)local_548[3],local_71c,local_718,200,(char *)0x0,0,1);
          if (iVar4 < 0) {
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
              in_stack_fffffffffffff700 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffff87f;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff700,
                         (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                          CONCAT16(in_stack_fffffffffffff6fe,
                                                   CONCAT15(in_stack_fffffffffffff6fd,
                                                            CONCAT14(in_stack_fffffffffffff6fc,
                                                                     in_stack_fffffffffffff6f8)))),
                         (allocator<char> *)in_stack_fffffffffffff6f0);
              std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
              std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
              console::initializeLogLocation
                        (in_stack_fffffffffffff6f0,
                         (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),
                         (Level)((ulong)in_stack_fffffffffffff6e0 >> 0x20));
              std::__cxx11::string::~string(local_740);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffff8a0);
              std::__cxx11::string::~string(local_780);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff87f);
            }
            if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
              console::setLogLocationLevel
                        (in_stack_fffffffffffff6c0,(Level)((ulong)in_stack_fffffffffffff6b8 >> 0x20)
                        );
              console::checkLogLocationEnabled
                        ((LogLocation *)
                         CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            }
            in_stack_fffffffffffff6ff = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
            if ((bool)in_stack_fffffffffffff6ff) {
              in_stack_fffffffffffff6c0 = (LogLocation *)local_548[1];
              in_stack_fffffffffffff6b8 = 0;
              console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                             (Level)(ulong)determineHost[abi:cxx11]()::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                             ,0x8c);
            }
          }
          else {
            iVar4 = strcmp("127.0.0.1",local_718);
            if ((iVar4 != 0) && (pcVar7 = strchr(local_718,0x3a), pcVar7 == (char *)0x0)) {
              if ((*(short *)local_548[3] == 10) && (local_648[0] == '\0')) {
                strcpy(local_648,local_718);
              }
              else {
                in_stack_fffffffffffff6fe = isPrivateIP(&in_stack_fffffffffffff6c0->initialized_);
                if (((bool)in_stack_fffffffffffff6fe) && (local_648[0] == '\0')) {
                  strcpy(local_648,local_718);
                }
                else {
                  in_stack_fffffffffffff6fd = isPrivateIP(&in_stack_fffffffffffff6c0->initialized_);
                  if ((!(bool)in_stack_fffffffffffff6fd) &&
                     ((in_stack_fffffffffffff6fc =
                            isPrivateIP(&in_stack_fffffffffffff6c0->initialized_),
                      (bool)in_stack_fffffffffffff6fc || (local_648[0] == '\0')))) {
                    strcpy(local_648,local_718);
                  }
                }
              }
            }
          }
        }
LAB_00475eb1:
        local_548 = (undefined8 *)*local_548;
      }
      freeifaddrs(local_550);
      if (local_648[0] == '\0') {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
          in_stack_fffffffffffff6f0 = local_7e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff700,
                     (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                      CONCAT16(in_stack_fffffffffffff6fe,
                                               CONCAT15(in_stack_fffffffffffff6fd,
                                                        CONCAT14(in_stack_fffffffffffff6fc,
                                                                 in_stack_fffffffffffff6f8)))),
                     (allocator<char> *)in_stack_fffffffffffff6f0);
          std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
          std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
          console::initializeLogLocation
                    (in_stack_fffffffffffff6f0,
                     (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),LVar9);
          std::__cxx11::string::~string(local_7a8);
          std::__cxx11::string::~string(local_7c8);
          std::__cxx11::string::~string((string *)&local_7e9[0].logger_enabled_);
          std::allocator<char>::~allocator((allocator<char> *)local_7e9);
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Error) {
          console::setLogLocationLevel(in_stack_fffffffffffff6c0,LVar8);
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        }
        local_7ea = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_7ea) {
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         (Level)(ulong)determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x9f,"std::string miniros::network::determineHost()",
                         "Couldn\'t find a preferred IP via the getifaddrs() call; I\'m assuming that your IP address is 127.0.0.1.  This should work for local processes, but will almost certainly not work if you have remote processes.Report to the ROS development team to seek a fix."
                        );
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff700,
                   (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                    CONCAT16(in_stack_fffffffffffff6fe,
                                             CONCAT15(in_stack_fffffffffffff6fd,
                                                      CONCAT14(in_stack_fffffffffffff6fc,
                                                               in_stack_fffffffffffff6f8)))),
                   (allocator<char> *)in_stack_fffffffffffff6f0);
        std::allocator<char>::~allocator(&local_7eb);
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((determineHost[abi:cxx11]()::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff700,
                     (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                      CONCAT16(in_stack_fffffffffffff6fe,
                                               CONCAT15(in_stack_fffffffffffff6fd,
                                                        CONCAT14(in_stack_fffffffffffff6fc,
                                                                 in_stack_fffffffffffff6f8)))),
                     (allocator<char> *)in_stack_fffffffffffff6f0);
          std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
          std::operator+(in_stack_fffffffffffff6c8,&in_stack_fffffffffffff6c0->initialized_);
          console::initializeLogLocation
                    (in_stack_fffffffffffff6f0,
                     (string *)CONCAT17(in_stack_fffffffffffff6ef,in_stack_fffffffffffff6e8),LVar9);
          std::__cxx11::string::~string(local_810);
          std::__cxx11::string::~string(local_830);
          std::__cxx11::string::~string(local_850);
          std::allocator<char>::~allocator(&local_851);
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
          console::setLogLocationLevel(in_stack_fffffffffffff6c0,LVar8);
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
        }
        local_852 = (determineHost[abi:cxx11]()::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_852) {
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         (Level)(ulong)determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0xa2,"std::string miniros::network::determineHost()",
                         "preferred IP is guessed to be %s",local_648);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff700,
                   (char *)CONCAT17(in_stack_fffffffffffff6ff,
                                    CONCAT16(in_stack_fffffffffffff6fe,
                                             CONCAT15(in_stack_fffffffffffff6fd,
                                                      CONCAT14(in_stack_fffffffffffff6fc,
                                                               in_stack_fffffffffffff6f8)))),
                   (allocator<char> *)in_stack_fffffffffffff6f0);
        std::allocator<char>::~allocator(&local_853);
      }
    }
  }
LAB_004763f5:
  local_c8 = 1;
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string determineHost()
{
  std::string ip_env;
  // First, did the user set ROS_HOSTNAME?
  if (get_environment_variable(ip_env, "ROS_HOSTNAME")) {
    MINIROS_DEBUG_NAMED("roscxx", "determineIP: using value of ROS_HOSTNAME:%s:", ip_env.c_str());
    if (ip_env.size() == 0) {
      MINIROS_WARN("invalid ROS_HOSTNAME (an empty string)");
    }
    return ip_env;
  }

  // Second, did the user set ROS_IP?
  if (get_environment_variable(ip_env, "ROS_IP")) {
    MINIROS_DEBUG("determineIP: using value of ROS_IP:%s:", ip_env.c_str());
    if (ip_env.size() == 0) {
      MINIROS_WARN("invalid ROS_IP (an empty string)");
    }
    return ip_env;
  }

  // Third, try the hostname
  char host[1024];
  memset(host, 0, sizeof(host));
  if (gethostname(host, sizeof(host) - 1) != 0) {
    MINIROS_ERROR("determineIP: gethostname failed");
  }
  // We don't want localhost to be our ip
  else if (strlen(host) && strcmp("localhost", host)) {
    return std::string(host);
  }

  // Fourth, fall back on interface search, which will yield an IP address

#ifdef HAVE_IFADDRS_H
  struct ifaddrs *ifa = NULL, *ifp = NULL;
  int rc;
  if ((rc = getifaddrs(&ifp)) < 0) {
    MINIROS_FATAL("error in getifaddrs: [%s]", strerror(rc));
    MINIROS_BREAK();
  }
  char preferred_ip[200] = {0};
  for (ifa = ifp; ifa; ifa = ifa->ifa_next) {
    char ip_[200];
    socklen_t salen;
    if (!ifa->ifa_addr)
      continue; // evidently this interface has no ip address
    if (ifa->ifa_addr->sa_family == AF_INET)
      salen = sizeof(struct sockaddr_in);
    else if (ifa->ifa_addr->sa_family == AF_INET6)
      salen = sizeof(struct sockaddr_in6);
    else
      continue;
    if (getnameinfo(ifa->ifa_addr, salen, ip_, sizeof(ip_), NULL, 0, NI_NUMERICHOST) < 0) {
      MINIROS_DEBUG_NAMED("roscxx", "getnameinfo couldn't get the ip of interface [%s]", ifa->ifa_name);
      continue;
    }
    // ROS_INFO( "ip of interface [%s] is [%s]", ifa->ifa_name, ip);
    //  prefer non-private IPs over private IPs
    if (!strcmp("127.0.0.1", ip_) || strchr(ip_, ':'))
      continue; // ignore loopback unless we have no other choice
    if (ifa->ifa_addr->sa_family == AF_INET6 && !preferred_ip[0])
      strcpy(preferred_ip, ip_);
    else if (isPrivateIP(ip_) && !preferred_ip[0])
      strcpy(preferred_ip, ip_);
    else if (!isPrivateIP(ip_) && (isPrivateIP(preferred_ip) || !preferred_ip[0]))
      strcpy(preferred_ip, ip_);
  }
  freeifaddrs(ifp);
  if (!preferred_ip[0]) {
    MINIROS_ERROR_NAMED("roscxx", "Couldn't find a preferred IP via the getifaddrs() call; I'm assuming that your IP "
                                  "address is 127.0.0.1.  This should work for local processes, "
                                  "but will almost certainly not work if you have remote processes."
                                  "Report to the ROS development team to seek a fix.");
    return std::string("127.0.0.1");
  }
  MINIROS_DEBUG_NAMED("roscxx", "preferred IP is guessed to be %s", preferred_ip);
  return std::string(preferred_ip);
#else
  // @todo Fix IP determination in the case where getifaddrs() isn't
  // available.
  MINIROS_ERROR("You don't have the getifaddrs() call; I'm assuming that your IP "
                "address is 127.0.0.1.  This should work for local processes, "
                "but will almost certainly not work if you have remote processes."
                "Report to the ROS development team to seek a fix.");
  return std::string("127.0.0.1");
#endif
}